

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O2

void __thiscall
FileTest_OpenBufferedFileError_Test::TestBody(FileTest_OpenBufferedFileError_Test *this)

{
  bool bVar1;
  char *message;
  string_view message_00;
  AssertHelper AStack_58;
  file local_4c;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    message_00.size_ = 0x1c;
    message_00.data_ = "cannot open file nonexistent";
    format_system_error_abi_cxx11_(&gtest_expected_message,2,message_00);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::file::file(&local_4c,(cstring_view)0x14156c,0);
      fmt::v5::file::~file(&local_4c);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [120])
               "Expected: file(\"nonexistent\", file::RDONLY) throws an exception of type fmt::system_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
             ,0xb6,message);
  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FileTest, OpenBufferedFileError) {
  EXPECT_SYSTEM_ERROR(file("nonexistent", file::RDONLY),
      ENOENT, "cannot open file nonexistent");
}